

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-test.cc
# Opt level: O2

void __thiscall MultiObjTestSolver<2>::~MultiObjTestSolver(MultiObjTestSolver<2> *this)

{
  mp::Solver::~Solver((Solver *)this);
  operator_delete(this,0x308);
  return;
}

Assistant:

explicit MultiObjTestSolver()
    : mp::SolverImpl<MultiObjMockProblemBuilder>("", 0, 0, FLAGS), builder(0) {}